

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Boundary.cpp
# Opt level: O0

int __thiscall CBoundary::IsFound(CBoundary *this,CWire *pWire)

{
  int iVar1;
  CNet *pCVar2;
  CWire *pWire_local;
  CBoundary *this_local;
  
  if (pWire == (CWire *)0x0) {
    __assert_fail("pWire",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Apodead[P]BoxRouter/br_64bit_release/Boundary.cpp"
                  ,0x135,"int CBoundary::IsFound(CWire *)");
  }
  pCVar2 = CWire::GetParent(pWire);
  if (pCVar2 != (CNet *)0x0) {
    pCVar2 = CWire::GetParent(pWire);
    iVar1 = IsFound(this,pCVar2);
    return iVar1;
  }
  __assert_fail("pWire->GetParent()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Apodead[P]BoxRouter/br_64bit_release/Boundary.cpp"
                ,0x136,"int CBoundary::IsFound(CWire *)");
}

Assistant:

int CBoundary::IsFound(CWire *pWire)
{
	//see if this wire is already crossing the boundary
	assert(pWire);
	assert(pWire->GetParent());
	return	IsFound(pWire->GetParent());
}